

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O1

void ucnv_toUnicode_UTF8_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *pUVar2;
  byte *pbVar3;
  UChar *pUVar4;
  UConverterSharedData *pUVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  byte *pbVar9;
  char *pcVar10;
  UChar UVar11;
  uint uVar12;
  UChar *pUVar13;
  byte bVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  byte *pbVar20;
  
  pUVar2 = args->converter;
  pbVar9 = (byte *)args->source;
  pUVar13 = args->target;
  piVar7 = args->offsets;
  pbVar3 = (byte *)args->sourceLimit;
  pUVar4 = args->targetLimit;
  pUVar5 = pUVar2->sharedData;
  uVar17 = (uint)pUVar2->toULength;
  iVar18 = 0;
  pbVar20 = pbVar9;
  if (pUVar4 <= pUVar13 || pUVar2->toULength < '\x01') goto LAB_002caceb;
  uVar12 = pUVar2->toUnicodeStatus;
  uVar15 = pUVar2->mode;
  pUVar2->toULength = '\0';
  pUVar2->toUnicodeStatus = 0;
  iVar18 = 0;
  do {
    if ((int)uVar17 < (int)uVar15) {
      uVar19 = (ulong)uVar17;
      lVar16 = 0;
      do {
        pbVar20 = pbVar9 + lVar16;
        if (pbVar3 <= pbVar20) {
          pUVar2->toUnicodeStatus = uVar12;
          pUVar2->mode = uVar15;
          pUVar2->toULength = (char)uVar17 + (char)lVar16;
          goto LAB_002cae47;
        }
        bVar1 = *pbVar20;
        pUVar2->toUBytes[lVar16 + uVar19] = bVar1;
        if (((int)uVar15 < 3) || (1 < uVar19 + lVar16)) {
          bVar14 = (char)bVar1 < -0x40;
        }
        else {
          if (uVar15 == 3) {
            bVar14 = '\x01' << (bVar1 >> 5);
            uVar8 = (ulong)(uVar12 & 0xf);
            pcVar10 = " 000000000000\x1000";
          }
          else {
            bVar14 = (byte)(1 << ((byte)uVar12 & 7));
            uVar8 = (ulong)(bVar1 >> 4);
            pcVar10 = "";
          }
          bVar14 = bVar14 & pcVar10[uVar8];
        }
        if ((bVar14 == 0) &&
           ((((pUVar5 != &_CESU8Data_63 || (uVar19 + lVar16 != 1)) || (uVar12 != 0xed)) ||
            (-0x41 < (char)bVar1)))) {
          uVar6 = uVar17 + (int)lVar16;
          break;
        }
        uVar12 = uVar12 * 0x40 + (uint)bVar1;
        lVar16 = lVar16 + 1;
        uVar6 = uVar15;
      } while ((int)(uVar17 + (int)lVar16) < (int)uVar15);
      uVar17 = uVar6;
      pbVar9 = pbVar9 + lVar16;
    }
    pbVar20 = pbVar9;
    if ((uVar17 != uVar15) || (pUVar5 == &_CESU8Data_63 && 3 < (int)uVar17)) {
      pUVar2->toULength = (int8_t)uVar17;
      *err = U_ILLEGAL_CHAR_FOUND;
LAB_002cae47:
      if ((pbVar20 < pbVar3) && ((pUVar4 <= pUVar13 && (*err < U_ILLEGAL_ARGUMENT_ERROR)))) {
        *err = U_BUFFER_OVERFLOW_ERROR;
      }
      args->target = pUVar13;
      args->source = (char *)pbVar20;
      args->offsets = piVar7;
      return;
    }
    uVar12 = uVar12 - offsetsFromUTF8[(int)uVar15];
    if (uVar12 < 0x10000) {
      *pUVar13 = (UChar)uVar12;
      pUVar13 = pUVar13 + 1;
      *piVar7 = iVar18;
      piVar7 = piVar7 + 1;
    }
    else {
      *pUVar13 = (short)(uVar12 >> 10) + L'ퟀ';
      *piVar7 = iVar18;
      UVar11 = (UChar)uVar12 & 0x3ffU | 0xdc00;
      if (pUVar13 + 1 < pUVar4) {
        pUVar13[1] = UVar11;
        pUVar13 = pUVar13 + 2;
        piVar7[1] = iVar18;
        piVar7 = piVar7 + 2;
      }
      else {
        piVar7 = piVar7 + 1;
        pUVar2->UCharErrorBuffer[0] = UVar11;
        pUVar2->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        pUVar13 = pUVar13 + 1;
      }
    }
    iVar18 = uVar17 + iVar18;
LAB_002caceb:
    while( true ) {
      if ((pbVar3 <= pbVar20) || (pUVar4 <= pUVar13)) goto LAB_002cae47;
      bVar1 = *pbVar20;
      if ((char)bVar1 < '\0') break;
      pbVar20 = pbVar20 + 1;
      *pUVar13 = (short)(char)bVar1;
      pUVar13 = pUVar13 + 1;
      *piVar7 = iVar18;
      piVar7 = piVar7 + 1;
      iVar18 = iVar18 + 1;
    }
    uVar12 = (uint)bVar1;
    pUVar2->toUBytes[0] = bVar1;
    pbVar9 = pbVar20 + 1;
    uVar15 = 0;
    uVar17 = 1;
    if ((byte)(bVar1 + 0x3e) < 0x33) {
      uVar15 = ((uint)(0xdf < bVar1) - (uint)(bVar1 < 0xf0)) + 3;
    }
  } while( true );
}

Assistant:

static void  U_CALLCONV ucnv_toUnicode_UTF8_OFFSETS_LOGIC (UConverterToUnicodeArgs * args,
                                                UErrorCode * err)
{
    UConverter *cnv = args->converter;
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    int32_t *myOffsets = args->offsets;
    int32_t offsetNum = 0;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = cnv->toUBytes;
    UBool isCESU8 = hasCESU8Data(cnv);
    uint32_t ch, ch2 = 0;
    int32_t i, inBytes;

    /* Restore size of current sequence */
    if (cnv->toULength > 0 && myTarget < targetLimit)
    {
        inBytes = cnv->mode;            /* restore # of bytes to consume */
        i = cnv->toULength;             /* restore # of bytes consumed */
        cnv->toULength = 0;

        ch = cnv->toUnicodeStatus;/*Stores the previously calculated ch from a previous call*/
        cnv->toUnicodeStatus = 0;
        goto morebytes;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);
        if (U8_IS_SINGLE(ch))        /* Simple case */
        {
            *(myTarget++) = (UChar) ch;
            *(myOffsets++) = offsetNum++;
        }
        else
        {
            toUBytes[0] = (char)ch;
            inBytes = U8_COUNT_BYTES_NON_ASCII(ch);
            i = 1;

morebytes:
            while (i < inBytes)
            {
                if (mySource < sourceLimit)
                {
                    toUBytes[i] = (char) (ch2 = *mySource);
                    if (!icu::UTF8::isValidTrail(ch, static_cast<uint8_t>(ch2), i, inBytes) &&
                            !(isCESU8 && i == 1 && ch == 0xed && U8_IS_TRAIL(ch2)))
                    {
                        break; /* i < inBytes */
                    }
                    ch = (ch << 6) + ch2;
                    ++mySource;
                    i++;
                }
                else
                {
                    cnv->toUnicodeStatus = ch;
                    cnv->mode = inBytes;
                    cnv->toULength = (int8_t)i;
                    goto donefornow;
                }
            }

            // In CESU-8, only surrogates, not supplementary code points, are encoded directly.
            if (i == inBytes && (!isCESU8 || i <= 3))
            {
                /* Remove the accumulated high bits */
                ch -= offsetsFromUTF8[inBytes];

                /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
                if (ch <= MAXIMUM_UCS2) 
                {
                    /* fits in 16 bits */
                    *(myTarget++) = (UChar) ch;
                    *(myOffsets++) = offsetNum;
                }
                else
                {
                    /* write out the surrogates */
                    *(myTarget++) = U16_LEAD(ch);
                    *(myOffsets++) = offsetNum;
                    ch = U16_TRAIL(ch);
                    if (myTarget < targetLimit)
                    {
                        *(myTarget++) = (UChar)ch;
                        *(myOffsets++) = offsetNum;
                    }
                    else
                    {
                        cnv->UCharErrorBuffer[0] = (UChar) ch;
                        cnv->UCharErrorBufferLength = 1;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }
                offsetNum += i;
            }
            else
            {
                cnv->toULength = (int8_t)i;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {   /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
    args->offsets = myOffsets;
}